

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.c
# Opt level: O3

void iterateArray(Array a,_func_void_Data_void_ptr_void_ptr *foreach,void *arg1,void *arg2)

{
  element *peVar1;
  
  peVar1 = a->head;
  while ((peVar1 != (element *)0x0 && (*(int *)((long)arg1 + 0x28) == 0))) {
    (*foreach)(peVar1->data,arg1,arg2);
    peVar1 = peVar1->next;
  }
  return;
}

Assistant:

void iterateArray(Array a, void (*foreach)(Data, void *, void *),
                  void *arg1, void *arg2) {
    struct element *el = a->head;
    VM vm = arg1;
    while (el) {
        if (vm->error_code)return;
        foreach(el->data, arg1, arg2);
        el = el->next;
    }
}